

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O1

void __thiscall duckdb::DuckTableEntry::CommitAlter(DuckTableEntry *this,string *column_name)

{
  size_t __n;
  DuckTableEntry *pDVar1;
  bool bVar2;
  int iVar3;
  ColumnList *pCVar4;
  ColumnDefinition *this_00;
  string *psVar5;
  column_t *pcVar6;
  LogicalIndex logical;
  PhysicalIndex column_index;
  DataTable *this_01;
  idx_t iVar7;
  int iVar8;
  ColumnList *pCVar9;
  idx_t iVar10;
  bool bVar11;
  ColumnListIterator CVar12;
  ColumnLogicalIteratorInternal __begin1;
  ColumnLogicalIteratorInternal local_68;
  optional_idx local_48;
  ColumnList *local_40;
  DuckTableEntry *local_38;
  
  local_48.index = 0xffffffffffffffff;
  pCVar9 = &(this->super_TableCatalogEntry).columns;
  CVar12 = ColumnList::Logical(pCVar9);
  pCVar4 = CVar12.list;
  local_68.physical = CVar12.physical;
  if (((undefined1  [16])CVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_68.end = ((long)(pCVar4->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar4->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  }
  else {
    local_68.end = (long)(pCVar4->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pCVar4->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
  }
  local_68.pos = 0;
  if (((undefined1  [16])CVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    iVar10 = ((long)(pCVar4->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar4->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  }
  else {
    iVar10 = (long)(pCVar4->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pCVar4->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  }
  if (((undefined1  [16])CVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    iVar7 = ((long)(pCVar4->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pCVar4->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  }
  else {
    iVar7 = (long)(pCVar4->physical_columns).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pCVar4->physical_columns).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  }
  local_68.list = pCVar4;
  pDVar1 = this;
  if ((iVar10 != 0) || (pDVar1 = this, local_68.end != iVar7)) {
    do {
      local_38 = pDVar1;
      local_40 = pCVar9;
      this_00 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*(&local_68);
      psVar5 = ColumnDefinition::Name_abi_cxx11_(this_00);
      __n = psVar5->_M_string_length;
      iVar8 = 0;
      bVar11 = false;
      if (__n == column_name->_M_string_length) {
        if (__n == 0) {
          bVar11 = true;
        }
        else {
          iVar3 = bcmp((psVar5->_M_dataplus)._M_p,(column_name->_M_dataplus)._M_p,__n);
          bVar11 = iVar3 == 0;
        }
      }
      if (bVar11) {
        bVar2 = ColumnDefinition::Generated(this_00);
        iVar8 = 1;
        if (!bVar2) {
          pcVar6 = ColumnDefinition::Oid(this_00);
          optional_idx::optional_idx(&local_48,*pcVar6);
          iVar8 = 2;
        }
      }
      pCVar9 = local_40;
      if (bVar11) goto LAB_0120a916;
      local_68.pos = local_68.pos + 1;
      pDVar1 = local_38;
    } while (((local_68.pos != iVar10) || (local_68.end != iVar7)) || (local_68.list != pCVar4));
    iVar8 = 2;
LAB_0120a916:
    this = local_38;
    if (iVar8 != 2) {
      return;
    }
  }
  logical.index = optional_idx::GetIndex(&local_48);
  column_index = ColumnList::LogicalToPhysical(pCVar9,logical);
  this_01 = shared_ptr<duckdb::DataTable,_true>::operator->(&this->storage);
  DataTable::CommitDropColumn(this_01,column_index.index);
  return;
}

Assistant:

void DuckTableEntry::CommitAlter(string &column_name) {
	D_ASSERT(!column_name.empty());
	optional_idx removed_index;
	for (auto &col : columns.Logical()) {
		if (col.Name() == column_name) {
			// No need to alter storage, removed column is generated column
			if (col.Generated()) {
				return;
			}
			removed_index = col.Oid();
			break;
		}
	}

	auto logical_column_index = LogicalIndex(removed_index.GetIndex());
	auto column_index = columns.LogicalToPhysical(logical_column_index).index;
	storage->CommitDropColumn(column_index);
}